

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void massageldifus(Item *qexp,Item *qb1,Item *qb2,Symbol *indx)

{
  long lVar1;
  Symbol *s_00;
  Item *pIVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  short *in_RSI;
  short *in_RDI;
  Item *q_1;
  Item *qb2_1;
  Item *qb1_1;
  Item *qexp_1;
  Symbol *s2;
  Symbol *s;
  Item *q1;
  Item *qs;
  Item *q;
  Symbol *in_stack_ffffffffffffff98;
  Symbol *in_stack_ffffffffffffffa0;
  Symbol *local_48;
  List *local_38;
  short *local_28;
  
  insertstr((Item *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  local_28 = in_RDI;
  if (in_RCX == 0) {
    insertstr((Item *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  else {
    for (; local_28 != in_RSI; local_28 = *(short **)(local_28 + 8)) {
      if ((*local_28 == 1) && (*(long *)(local_28 + 4) == in_RCX)) {
        replacstr((Item *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      }
    }
    insertstr((Item *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  if (ldifuslist == (List *)0x0) {
    ldifuslist = newlist();
  }
  local_28 = (short *)*(long *)(in_RSI + 8);
  do {
    if (local_28 == (short *)in_RDX) {
      return;
    }
    lVar1 = *(long *)((long)local_28 + 0x10);
    s_00 = *(Symbol **)((long)local_28 + 8);
    local_48 = (Symbol *)0x0;
    if (((s_00->subtype & 0x10U) == 0) && (iVar3 = in_solvefor(s_00), iVar3 != 0)) {
      delete((Item *)0x113d72);
      diag((char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    }
    lappendsym((List *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    lappenditem((List *)in_stack_ffffffffffffffa0,(Item *)in_stack_ffffffffffffff98);
    lappenditem((List *)in_stack_ffffffffffffffa0,(Item *)in_stack_ffffffffffffff98);
    if (compartlist != (List *)0x0) {
      local_38 = compartlist->next;
      while (local_38 != compartlist) {
        pIVar2 = local_38->next->next;
        in_stack_ffffffffffffffa0 = (Symbol *)(pIVar2->element).lst;
        for (in_stack_ffffffffffffff98 = (Symbol *)(local_38->next->element).itm;
            (in_stack_ffffffffffffff98 != in_stack_ffffffffffffffa0 &&
            ((in_stack_ffffffffffffff98->type != 1 ||
             (local_48 = (Symbol *)in_stack_ffffffffffffff98->subtype, s_00 != local_48))));
            in_stack_ffffffffffffff98 = *(Symbol **)&in_stack_ffffffffffffff98->nrntype) {
        }
        if (s_00 == local_48) {
          lappenditem((List *)in_stack_ffffffffffffffa0,(Item *)in_stack_ffffffffffffff98);
          lappenditem((List *)in_stack_ffffffffffffffa0,(Item *)in_stack_ffffffffffffff98);
          break;
        }
        local_38 = pIVar2->next;
      }
    }
    if (s_00 != local_48) {
      diag((char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    }
    lappendstr((List *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    lappendstr((List *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    local_28 = (short *)lVar1;
  } while( true );
}

Assistant:

void massageldifus(qexp, qb1, qb2, indx)
	Item *qexp, *qb1, *qb2;
	Symbol *indx;
{
	Item *q, *qs, *q1;
	Symbol* s, *s2;
	
	/* surround the statement with comments so that the expession
	   will benignly exist for later use */
	/*SUPPRESS 440*/
	Insertstr(qb2->next, "*/\n");

	if (indx) {
		for (q = qexp; q != qb1; q = q->next) {
			if (q->itemtype == SYMBOL && SYM(q) == indx) {
				replacstr(q, "_i");
			}
		}
		/*SUPPRESS 440*/
		Insertstr(qexp->prev->prev->prev, "/*");
	}else{
		/*SUPPRESS 440*/
		Insertstr(qexp->prev, "/*");
	}
	if (!ldifuslist) {
		ldifuslist = newlist();
	}
	for (q = qb1->next; q != qb2; q = qs) {
		qs = q->next;
		s = SYM(q);
		s2 = SYM0;
		if (!(s->subtype & STAT) && in_solvefor(s)) {
			delete(q);
diag(SYM(q)->name, "must be a (solved) STATE in a LONGITUDINAL_DIFFUSION statement");
		}
		lappendsym(ldifuslist, s);
		Lappenditem(ldifuslist, qexp);
		Lappenditem(ldifuslist, qb1);
		/* store the COMPARTMENT volume expression for this sym */
		q1 = compartlist;
		if (q1) ITERATE(q1, compartlist) {
			Item *qexp, *qb1, *qb2, *q;
			qexp = ITM(q1); q1 = q1->next;
			qb1 = ITM(q1); q1 = q1->next;
			qb2 = ITM(q1);
			for (q = qb1; q != qb2; q = q->next) {
				if (q->itemtype == SYMBOL) {
					s2 = SYM(q);
					if (s == s2) break;
				}
			}
			if (s == s2) {
				lappenditem(ldifuslist, qexp);
				lappenditem(ldifuslist, qb1);
				break;
			}
		}
		if (s != s2) {
			diag(SYM(q)->name, "must be declared in COMPARTMENT");
		}
		lappendstr(ldifuslist, "0"); /* will be flux conc index if any */
		lappendstr(ldifuslist, ""); /* will be dflux/dconc if any */
	}
}